

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opt.cpp
# Opt level: O3

void opt_Parse(char *s)

{
  byte bVar1;
  char cVar2;
  int iVar3;
  char *in_RAX;
  ulong newDepth;
  size_t sVar4;
  bool *pbVar5;
  int *piVar6;
  uint uVar7;
  char *pcVar8;
  char *endptr;
  char *local_28;
  
  bVar1 = *s;
  local_28 = in_RAX;
  if (bVar1 < 0x57) {
    if (bVar1 < 0x4c) {
      if (bVar1 == 0x21) {
        uVar7 = (uint)s[1];
        switch(uVar7 << 0x1e | uVar7 - 0x48 >> 2) {
        case 0:
          if (s[2] == '\0') {
            pbVar5 = &warnOnHaltNop;
LAB_00110449:
            *pbVar5 = true;
            return;
          }
          pcVar8 = "Option \'!H\' does not take an argument\n";
          break;
        case 1:
          if (s[2] == '\0') {
            pbVar5 = &optimizeLoads;
            goto LAB_00110449;
          }
          pcVar8 = "Option \'!L\' does not take an argument\n";
          break;
        default:
          pcVar8 = "Unknown option \'!%c\'\n";
          goto LAB_00110279;
        case 8:
          if (s[2] == '\0') {
            pbVar5 = &haltNop;
            goto LAB_00110449;
          }
          pcVar8 = "Option \'!h\' does not take an argument\n";
          break;
        case 9:
          if (s[2] == '\0') {
            pbVar5 = &warnOnLdOpt;
            goto LAB_00110449;
          }
          pcVar8 = "Option \'!l\' does not take an argument\n";
        }
LAB_001103b8:
        error(pcVar8);
        return;
      }
      if (bVar1 != 0x48) goto switchD_001100e1_caseD_69;
      if (s[1] != '\0') {
        pcVar8 = "Option \'H\' does not take an argument\n";
        goto LAB_001103b8;
      }
      pbVar5 = &warnOnHaltNop;
    }
    else {
      if (bVar1 != 0x4c) {
        if (bVar1 == 0x51) {
          pcVar8 = s + 1;
          if (s[1] == '.') {
            pcVar8 = s + 2;
          }
          sVar4 = strlen(pcVar8);
          if (2 < sVar4) {
            pcVar8 = "Invalid argument for option \'Q\'\n";
            goto LAB_001103b8;
          }
          iVar3 = __isoc99_sscanf(pcVar8,"%u",&local_28);
          if (iVar3 == 1) {
            if (0xffffffe0 < (uint)local_28 - 0x20) {
              fixPrecision = (uint8_t)(uint)local_28;
              return;
            }
            pcVar8 = "Argument for option \'Q\' must be between 1 and 31\n";
          }
          else {
            pcVar8 = "Invalid argument for option \'Q\'\n";
          }
          goto LAB_001103dc;
        }
        goto switchD_001100e1_caseD_69;
      }
      if (s[1] != '\0') {
        pcVar8 = "Option \'L\' does not take an argument\n";
        goto LAB_001103b8;
      }
      pbVar5 = &optimizeLoads;
    }
    goto LAB_00110367;
  }
  switch(bVar1) {
  case 0x67:
    sVar4 = strlen(s + 1);
    if (sVar4 != 4) {
      pcVar8 = "Must specify exactly 4 characters for option \'g\'\n";
      goto LAB_001103b8;
    }
    gfxDigits = *(char (*) [4])(s + 1);
    break;
  case 0x68:
    if (s[1] != '\0') {
      pcVar8 = "Option \'h\' does not take an argument\n";
      goto LAB_001103b8;
    }
    pbVar5 = &haltNop;
    goto LAB_00110367;
  case 0x69:
  case 0x6a:
  case 0x6b:
  case 0x6d:
  case 0x6e:
  case 0x6f:
  case 0x71:
    goto switchD_001100e1_caseD_69;
  case 0x6c:
    if (s[1] != '\0') {
      pcVar8 = "Option \'l\' does not take an argument\n";
      goto LAB_001103b8;
    }
    pbVar5 = &warnOnLdOpt;
LAB_00110367:
    *pbVar5 = false;
    break;
  case 0x70:
    sVar4 = strlen(s + 1);
    if (2 < sVar4) {
      pcVar8 = "Invalid argument for option \'p\'\n";
      goto LAB_001103b8;
    }
    iVar3 = __isoc99_sscanf(s + 1,"%x",&local_28);
    if (iVar3 == 1) {
      if ((uint)local_28 < 0x100) {
        fillByte = (uint8_t)(uint)local_28;
        return;
      }
      pcVar8 = "Argument for option \'p\' must be between 0 and 0xFF\n";
    }
    else {
      pcVar8 = "Invalid argument for option \'p\'\n";
    }
LAB_001103dc:
    error(pcVar8);
    break;
  case 0x72:
    do {
      cVar2 = s[1];
      s = s + 1;
      iVar3 = isblank((int)cVar2);
    } while (iVar3 != 0);
    if (cVar2 == '\0') {
      pcVar8 = "Missing argument to option \'r\'\n";
      goto LAB_001103b8;
    }
    newDepth = strtoul(s,&local_28,10);
    if (*local_28 == '\0') {
      piVar6 = __errno_location();
      if (*piVar6 != 0x22) {
        fstk_NewRecursionDepth(newDepth);
        lexer_CheckRecursionDepth();
        return;
      }
      pcVar8 = "Argument to \'r\' is out of range (\"%s\")\n";
    }
    else {
      pcVar8 = "Invalid argument to option \'r\' (\"%s\")\n";
    }
    error(pcVar8,s);
    break;
  default:
    if (bVar1 == 0x57) {
      if (s[1] != '\0') {
        processWarningFlag(s + 1);
        return;
      }
      pcVar8 = "Must specify an argument for option \'W\'\n";
      goto LAB_001103b8;
    }
    if (bVar1 == 0x62) {
      sVar4 = strlen(s + 1);
      if (sVar4 == 2) {
        binDigits = *(char (*) [2])(s + 1);
        return;
      }
      pcVar8 = "Must specify exactly 2 characters for option \'b\'\n";
      goto LAB_001103b8;
    }
    goto switchD_001100e1_caseD_69;
  }
  return;
switchD_001100e1_caseD_69:
  uVar7 = (uint)(char)bVar1;
  pcVar8 = "Unknown option \'%c\'\n";
LAB_00110279:
  error(pcVar8,(ulong)uVar7);
  return;
}

Assistant:

void opt_Parse(char *s)
{
	switch (s[0]) {
	case 'b':
		if (strlen(&s[1]) == 2)
			opt_B(&s[1]);
		else
			error("Must specify exactly 2 characters for option 'b'\n");
		break;

	case 'g':
		if (strlen(&s[1]) == 4)
			opt_G(&s[1]);
		else
			error("Must specify exactly 4 characters for option 'g'\n");
		break;

	case 'p':
		if (strlen(&s[1]) <= 2) {
			int result;
			unsigned int padByte;

			result = sscanf(&s[1], "%x", &padByte);
			if (result != 1)
				error("Invalid argument for option 'p'\n");
			else if (padByte > 0xFF)
				error("Argument for option 'p' must be between 0 and 0xFF\n");
			else
				opt_P(padByte);
		} else {
			error("Invalid argument for option 'p'\n");
		}
		break;

		const char *precisionArg;
	case 'Q':
		precisionArg = &s[1];
		if (precisionArg[0] == '.')
			precisionArg++;
		if (strlen(precisionArg) <= 2) {
			int result;
			unsigned int precision;

			result = sscanf(precisionArg, "%u", &precision);
			if (result != 1)
				error("Invalid argument for option 'Q'\n");
			else if (precision < 1 || precision > 31)
				error("Argument for option 'Q' must be between 1 and 31\n");
			else
				opt_Q(precision);
		} else {
			error("Invalid argument for option 'Q'\n");
		}
		break;

	case 'r': {
		++s; // Skip 'r'
		while (isblank(*s))
			++s; // Skip leading whitespace

		if (s[0] == '\0') {
			error("Missing argument to option 'r'\n");
			break;
		}

		char *endptr;
		unsigned long newDepth = strtoul(s, &endptr, 10);

		if (*endptr != '\0') {
			error("Invalid argument to option 'r' (\"%s\")\n", s);
		} else if (errno == ERANGE) {
			error("Argument to 'r' is out of range (\"%s\")\n", s);
		} else {
			opt_R(newDepth);
		}
		break;
	}

	case 'H':
		if (s[1] == '\0')
			opt_H(false);
		else
			error("Option 'H' does not take an argument\n");
		break;

	case 'h':
		if (s[1] == '\0')
			opt_h(false);
		else
			error("Option 'h' does not take an argument\n");
		break;

	case 'L':
		if (s[1] == '\0')
			opt_L(false);
		else
			error("Option 'L' does not take an argument\n");
		break;

	case 'l':
		if (s[1] == '\0')
			opt_l(false);
		else
			error("Option 'l' does not take an argument\n");
		break;

	case 'W':
		if (strlen(&s[1]) > 0)
			opt_W(&s[1]);
		else
			error("Must specify an argument for option 'W'\n");
		break;

	case '!': // negates flag options that do not take an argument
		switch (s[1]) {
		case 'H':
			if (s[2] == '\0')
				opt_H(true);
			else
				error("Option '!H' does not take an argument\n");
			break;

		case 'h':
			if (s[2] == '\0')
				opt_h(true);
			else
				error("Option '!h' does not take an argument\n");
			break;

		case 'L':
			if (s[2] == '\0')
				opt_L(true);
			else
				error("Option '!L' does not take an argument\n");
			break;

		case 'l':
			if (s[2] == '\0')
				opt_l(true);
			else
				error("Option '!l' does not take an argument\n");
			break;

		default:
			error("Unknown option '!%c'\n", s[1]);
			break;
		}
		break;

	default:
		error("Unknown option '%c'\n", s[0]);
		break;
	}
}